

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O2

xmlParserInputBufferCreateFilenameFunc
xmlThrDefParserInputBufferCreateFilenameDefault(xmlParserInputBufferCreateFilenameFunc func)

{
  xmlParserInputBufferCreateFilenameFunc p_Var1;
  
  xmlMutexLock(xmlThrDefMutex);
  p_Var1 = xmlParserInputBufferCreateFilenameValueThrDef;
  if (xmlParserInputBufferCreateFilenameValueThrDef == (xmlParserInputBufferCreateFilenameFunc)0x0)
  {
    p_Var1 = __xmlParserInputBufferCreateFilename;
  }
  xmlParserInputBufferCreateFilenameValueThrDef = func;
  xmlMutexUnlock(xmlThrDefMutex);
  return p_Var1;
}

Assistant:

xmlParserInputBufferCreateFilenameFunc
xmlThrDefParserInputBufferCreateFilenameDefault(xmlParserInputBufferCreateFilenameFunc func)
{
    xmlParserInputBufferCreateFilenameFunc old;

    xmlMutexLock(xmlThrDefMutex);
    old = xmlParserInputBufferCreateFilenameValueThrDef;
    if (old == NULL) {
		old = __xmlParserInputBufferCreateFilename;
	}

    xmlParserInputBufferCreateFilenameValueThrDef = func;
    xmlMutexUnlock(xmlThrDefMutex);

    return(old);
}